

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O0

void __thiscall
flow::diagnostics::Report::warning<flow::Signature>
          (Report *this,SourceLocation *sloc,string *f,Signature *args)

{
  string_view local_90;
  string local_80;
  SourceLocation local_60;
  Signature *local_28;
  Signature *args_local;
  string *f_local;
  SourceLocation *sloc_local;
  Report *this_local;
  
  local_28 = args;
  args_local = (Signature *)f;
  f_local = &sloc->filename;
  sloc_local = (SourceLocation *)this;
  SourceLocation::SourceLocation(&local_60,sloc);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            (&local_90,&args_local->name_);
  fmt::v5::format<flow::Signature>(&local_80,local_90,args);
  emplace_back(this,Warning,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  SourceLocation::~SourceLocation(&local_60);
  return;
}

Assistant:

void warning(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::Warning, sloc, fmt::format(f, std::move(args)...));
  }